

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(char lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_12;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> local_11;
  
  bVar1 = ModulusSimpleCaseHelper<char,_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::ModulusSimpleCase(lhs,rhs,&local_12);
  if (bVar1) {
    local_12.m_int = '\0';
  }
  else {
    local_12 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                         (&local_11,rhs.m_int);
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_12.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}